

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

uint8 * __thiscall
google::protobuf::UninterpretedOption::InternalSerializeWithCachedSizesToArray
          (UninterpretedOption *this,uint8 *target,EpsCopyOutputStream *stream)

{
  uint uVar1;
  uint uVar2;
  uint32 uVar3;
  uint32 uVar4;
  uint8 *puVar5;
  uint64 uVar6;
  char *data;
  EpsCopyOutputStream *in_RDX;
  EpsCopyOutputStream *in_RSI;
  UninterpretedOption *in_RDI;
  double value;
  uint n;
  uint i;
  uint32 cached_has_bits;
  uint8 **in_stack_fffffffffffffe48;
  UninterpretedOption *in_stack_fffffffffffffe50;
  undefined8 in_stack_fffffffffffffe58;
  uint8 *in_stack_fffffffffffffe68;
  EpsCopyOutputStream *in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe80;
  uint local_178;
  UninterpretedOption *target_00;
  InternalMetadataWithArena *unknown_fields;
  
  local_178 = 0;
  target_00 = in_RDI;
  uVar2 = _internal_name_size((UninterpretedOption *)0x52b715);
  for (; uVar3 = (uint32)((ulong)in_stack_fffffffffffffe58 >> 0x20), local_178 < uVar2;
      local_178 = local_178 + 1) {
    io::EpsCopyOutputStream::EnsureSpace
              ((EpsCopyOutputStream *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
    _internal_name(in_stack_fffffffffffffe50,(int)((ulong)in_stack_fffffffffffffe48 >> 0x20));
    uVar3 = internal::WireFormatLite::MakeTag(2,WIRETYPE_LENGTH_DELIMITED);
    puVar5 = io::CodedOutputStream::WriteVarint32ToArray(uVar3,(uint8 *)in_RSI);
    uVar3 = UninterpretedOption_NamePart::GetCachedSize((UninterpretedOption_NamePart *)0x52b7f2);
    io::CodedOutputStream::WriteVarint32ToArray(uVar3,puVar5);
    in_RSI = (EpsCopyOutputStream *)
             UninterpretedOption_NamePart::InternalSerializeWithCachedSizesToArray
                       ((UninterpretedOption_NamePart *)CONCAT44(uVar2,in_stack_fffffffffffffe80),
                        (uint8 *)in_RDI,in_stack_fffffffffffffe70);
  }
  uVar1 = (in_RDI->_has_bits_).has_bits_[0];
  if ((uVar1 & 1) != 0) {
    _internal_identifier_value_abi_cxx11_((UninterpretedOption *)0x52b884);
    in_stack_fffffffffffffe68 = (uint8 *)std::__cxx11::string::data();
    _internal_identifier_value_abi_cxx11_((UninterpretedOption *)0x52b89b);
    std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8StringNamedField
              ((char *)in_stack_fffffffffffffe50,(int)((ulong)in_stack_fffffffffffffe48 >> 0x20),
               (Operation)in_stack_fffffffffffffe48,(char *)0x52b8bb);
    in_stack_fffffffffffffe70 = in_RDX;
    _internal_identifier_value_abi_cxx11_((UninterpretedOption *)0x52b8cf);
    in_RSI = (EpsCopyOutputStream *)
             io::EpsCopyOutputStream::WriteStringMaybeAliased
                       ((EpsCopyOutputStream *)CONCAT44(uVar2,in_stack_fffffffffffffe80),
                        (uint32)((ulong)in_RDI >> 0x20),(string *)in_stack_fffffffffffffe70,
                        in_stack_fffffffffffffe68);
  }
  if ((uVar1 & 8) != 0) {
    io::EpsCopyOutputStream::EnsureSpace
              ((EpsCopyOutputStream *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
    uVar6 = _internal_positive_int_value(in_RDI);
    uVar4 = internal::WireFormatLite::MakeTag(4,WIRETYPE_VARINT);
    puVar5 = io::CodedOutputStream::WriteVarint32ToArray(uVar4,(uint8 *)in_RSI);
    in_RSI = (EpsCopyOutputStream *)io::CodedOutputStream::WriteVarint64ToArray(uVar6,puVar5);
  }
  if ((uVar1 & 0x10) != 0) {
    io::EpsCopyOutputStream::EnsureSpace
              ((EpsCopyOutputStream *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
    uVar6 = _internal_negative_int_value(in_RDI);
    uVar4 = internal::WireFormatLite::MakeTag(5,WIRETYPE_VARINT);
    puVar5 = io::CodedOutputStream::WriteVarint32ToArray(uVar4,(uint8 *)in_RSI);
    in_RSI = (EpsCopyOutputStream *)io::CodedOutputStream::WriteVarint64ToArray(uVar6,puVar5);
  }
  if ((uVar1 & 0x20) != 0) {
    io::EpsCopyOutputStream::EnsureSpace
              ((EpsCopyOutputStream *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
    value = _internal_double_value(in_RDI);
    uVar4 = internal::WireFormatLite::MakeTag(6,WIRETYPE_FIXED64);
    puVar5 = io::CodedOutputStream::WriteVarint32ToArray(uVar4,(uint8 *)in_RSI);
    uVar6 = internal::WireFormatLite::EncodeDouble(value);
    in_RSI = (EpsCopyOutputStream *)io::CodedOutputStream::WriteLittleEndian64ToArray(uVar6,puVar5);
  }
  if ((uVar1 & 2) != 0) {
    _internal_string_value_abi_cxx11_((UninterpretedOption *)0x52bbf9);
    in_RSI = (EpsCopyOutputStream *)
             io::EpsCopyOutputStream::WriteBytesMaybeAliased
                       (in_RDX,uVar3,(string *)in_stack_fffffffffffffe50,
                        (uint8 *)in_stack_fffffffffffffe48);
  }
  if ((uVar1 & 4) != 0) {
    _internal_aggregate_value_abi_cxx11_((UninterpretedOption *)0x52bc2b);
    data = (char *)std::__cxx11::string::data();
    _internal_aggregate_value_abi_cxx11_((UninterpretedOption *)0x52bc42);
    std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8StringNamedField
              (data,(int)((ulong)in_stack_fffffffffffffe48 >> 0x20),
               (Operation)in_stack_fffffffffffffe48,(char *)0x52bc62);
    _internal_aggregate_value_abi_cxx11_((UninterpretedOption *)0x52bc76);
    in_RSI = (EpsCopyOutputStream *)
             io::EpsCopyOutputStream::WriteStringMaybeAliased
                       ((EpsCopyOutputStream *)CONCAT44(uVar2,in_stack_fffffffffffffe80),
                        (uint32)((ulong)in_RDI >> 0x20),(string *)in_stack_fffffffffffffe70,
                        in_stack_fffffffffffffe68);
  }
  unknown_fields = &in_RDI->_internal_metadata_;
  if (((uint)(unknown_fields->
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ).ptr_ & 1) == 1) {
    if (((uint)(in_RDI->_internal_metadata_).
               super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               .ptr_ & 1) == 1) {
      internal::
      InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
      ::
      PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>::Container>
                ((InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
                  *)&in_RDI->_internal_metadata_);
    }
    else {
      internal::InternalMetadataWithArena::default_instance();
    }
    in_RSI = (EpsCopyOutputStream *)
             internal::WireFormat::InternalSerializeUnknownFieldsToArray
                       ((UnknownFieldSet *)unknown_fields,(uint8 *)target_00,in_RSI);
  }
  return (uint8 *)in_RSI;
}

Assistant:

::PROTOBUF_NAMESPACE_ID::uint8* UninterpretedOption::InternalSerializeWithCachedSizesToArray(
    ::PROTOBUF_NAMESPACE_ID::uint8* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.UninterpretedOption)
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated .google.protobuf.UninterpretedOption.NamePart name = 2;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_name_size()); i < n; i++) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessageToArray(2, this->_internal_name(i), target, stream);
  }

  cached_has_bits = _has_bits_[0];
  // optional string identifier_value = 3;
  if (cached_has_bits & 0x00000001u) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      this->_internal_identifier_value().data(), static_cast<int>(this->_internal_identifier_value().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "google.protobuf.UninterpretedOption.identifier_value");
    target = stream->WriteStringMaybeAliased(
        3, this->_internal_identifier_value(), target);
  }

  // optional uint64 positive_int_value = 4;
  if (cached_has_bits & 0x00000008u) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteUInt64ToArray(4, this->_internal_positive_int_value(), target);
  }

  // optional int64 negative_int_value = 5;
  if (cached_has_bits & 0x00000010u) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt64ToArray(5, this->_internal_negative_int_value(), target);
  }

  // optional double double_value = 6;
  if (cached_has_bits & 0x00000020u) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteDoubleToArray(6, this->_internal_double_value(), target);
  }

  // optional bytes string_value = 7;
  if (cached_has_bits & 0x00000002u) {
    target = stream->WriteBytesMaybeAliased(
        7, this->_internal_string_value(), target);
  }

  // optional string aggregate_value = 8;
  if (cached_has_bits & 0x00000004u) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      this->_internal_aggregate_value().data(), static_cast<int>(this->_internal_aggregate_value().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "google.protobuf.UninterpretedOption.aggregate_value");
    target = stream->WriteStringMaybeAliased(
        8, this->_internal_aggregate_value(), target);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::InternalSerializeUnknownFieldsToArray(
        _internal_metadata_.unknown_fields(), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.UninterpretedOption)
  return target;
}